

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWmonitor *pGVar1;
  GLFWvidmode *pGVar2;
  GLFWvidmode *mode;
  GLFWmonitor *monitor;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    switch(key) {
    case 0x100:
      glfwSetWindowShouldClose(window,1);
      break;
    case 0x101:
    case 300:
      if (mods == 4) {
        pGVar1 = glfwGetWindowMonitor(window);
        if (pGVar1 == (GLFWmonitor *)0x0) {
          pGVar1 = glfwGetPrimaryMonitor();
          pGVar2 = glfwGetVideoMode(pGVar1);
          glfwGetWindowPos(window,&key_callback::x,&key_callback::y);
          glfwGetWindowSize(window,&key_callback::width,&key_callback::height);
          glfwSetWindowMonitor(window,pGVar1,0,0,pGVar2->width,pGVar2->height,pGVar2->refreshRate);
        }
        else {
          glfwSetWindowMonitor
                    (window,(GLFWmonitor *)0x0,key_callback::x,key_callback::y,key_callback::width,
                     key_callback::height,0);
        }
      }
      break;
    case 0x108:
      if (swap_tear == 0) {
        if (-1 < swap_interval + -1) {
          set_swap_interval(window,swap_interval + -1);
        }
      }
      else if (swap_interval + -1 < swap_interval) {
        set_swap_interval(window,swap_interval + -1);
      }
      break;
    case 0x109:
      if (swap_interval < swap_interval + 1) {
        set_swap_interval(window,swap_interval + 1);
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_UP:
        {
            if (swap_interval + 1 > swap_interval)
                set_swap_interval(window, swap_interval + 1);
            break;
        }

        case GLFW_KEY_DOWN:
        {
            if (swap_tear)
            {
                if (swap_interval - 1 < swap_interval)
                    set_swap_interval(window, swap_interval - 1);
            }
            else
            {
                if (swap_interval - 1 >= 0)
                    set_swap_interval(window, swap_interval - 1);
            }
            break;
        }

        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, 1);
            break;

        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            static int x, y, width, height;

            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
                glfwSetWindowMonitor(window, NULL, x, y, width, height, 0);
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                glfwGetWindowPos(window, &x, &y);
                glfwGetWindowSize(window, &width, &height);
                glfwSetWindowMonitor(window, monitor,
                                     0, 0, mode->width, mode->height,
                                     mode->refreshRate);
            }

            break;
        }
    }
}